

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal_progress_bar_display.cpp
# Opt level: O1

void __thiscall
duckdb::TerminalProgressBarDisplay::PrintProgressInternal
          (TerminalProgressBarDisplay *this,int32_t percentage)

{
  uint uVar1;
  long *plVar2;
  uint uVar3;
  long *plVar4;
  ulong uVar5;
  ulong uVar6;
  uint __val;
  uint __len;
  long lVar7;
  double dVar8;
  string result;
  string __str;
  string local_a8;
  long *local_88;
  long local_80;
  long local_78;
  long lStack_70;
  undefined1 *local_68 [2];
  undefined1 local_58 [16];
  double local_48;
  
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  local_a8._M_string_length = 0;
  local_a8.field_2._M_local_buf[0] = '\0';
  ::std::__cxx11::string::_M_replace((ulong)&local_a8,0,(char *)0x0,0x12d8b4c);
  if (percentage < 100) {
    ::std::__cxx11::string::append((char *)&local_a8);
  }
  if (percentage < 10) {
    ::std::__cxx11::string::append((char *)&local_a8);
  }
  __val = -percentage;
  if (0 < percentage) {
    __val = percentage;
  }
  __len = 1;
  if (9 < __val) {
    uVar5 = (ulong)__val;
    uVar1 = 4;
    do {
      __len = uVar1;
      uVar3 = (uint)uVar5;
      if (uVar3 < 100) {
        __len = __len - 2;
        goto LAB_00ad5840;
      }
      if (uVar3 < 1000) {
        __len = __len - 1;
        goto LAB_00ad5840;
      }
      if (uVar3 < 10000) goto LAB_00ad5840;
      uVar5 = uVar5 / 10000;
      uVar1 = __len + 4;
    } while (99999 < uVar3);
    __len = __len + 1;
  }
LAB_00ad5840:
  local_68[0] = local_58;
  ::std::__cxx11::string::_M_construct((ulong)local_68,(char)__len - (char)(percentage >> 0x1f));
  ::std::__detail::__to_chars_10_impl<unsigned_int>
            (local_68[0] + ((uint)percentage >> 0x1f),__len,__val);
  plVar2 = (long *)::std::__cxx11::string::append((char *)local_68);
  plVar4 = plVar2 + 2;
  if ((long *)*plVar2 == plVar4) {
    local_78 = *plVar4;
    lStack_70 = plVar2[3];
    local_88 = &local_78;
  }
  else {
    local_78 = *plVar4;
    local_88 = (long *)*plVar2;
  }
  local_80 = plVar2[1];
  *plVar2 = (long)plVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  ::std::__cxx11::string::_M_append((char *)&local_a8,(ulong)local_88);
  if (local_88 != &local_78) {
    operator_delete(local_88);
  }
  if (local_68[0] != local_58) {
    operator_delete(local_68[0]);
  }
  ::std::__cxx11::string::append((char *)&local_a8);
  ::std::__cxx11::string::append((char *)&local_a8);
  dVar8 = ((double)percentage / 100.0) * 60.0;
  uVar6 = (long)(dVar8 - 9.223372036854776e+18) & (long)dVar8 >> 0x3f | (long)dVar8;
  uVar5 = uVar6;
  if (uVar6 == 0) {
    uVar6 = 0;
  }
  else {
    do {
      local_48 = dVar8;
      ::std::__cxx11::string::append((char *)&local_a8);
      uVar5 = uVar5 - 1;
      dVar8 = local_48;
    } while (uVar5 != 0);
  }
  if (uVar6 < 0x3c) {
    ::std::__cxx11::string::append((char *)&local_a8);
    uVar6 = uVar6 + 1;
  }
  if (uVar6 < 0x3c) {
    lVar7 = uVar6 - 0x3c;
    do {
      ::std::__cxx11::string::append((char *)&local_a8);
      lVar7 = lVar7 + 1;
    } while (lVar7 != 0);
  }
  ::std::__cxx11::string::append((char *)&local_a8);
  ::std::__cxx11::string::append((char *)&local_a8);
  Printer::RawPrint(STREAM_STDOUT,&local_a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  return;
}

Assistant:

void TerminalProgressBarDisplay::PrintProgressInternal(int32_t percentage) {
	string result;
	// we divide the number of blocks by the percentage
	// 0%   = 0
	// 100% = PROGRESS_BAR_WIDTH
	// the percentage determines how many blocks we need to draw
	double blocks_to_draw = PROGRESS_BAR_WIDTH * (percentage / 100.0);
	// because of the power of unicode, we can also draw partial blocks

	// render the percentage with some padding to ensure everything stays nicely aligned
	result = "\r";
	if (percentage < 100) {
		result += " ";
	}
	if (percentage < 10) {
		result += " ";
	}
	result += to_string(percentage) + "%";
	result += " ";
	result += PROGRESS_START;
	idx_t i;
	for (i = 0; i < idx_t(blocks_to_draw); i++) {
		result += PROGRESS_BLOCK;
	}
	if (i < PROGRESS_BAR_WIDTH) {
		// print a partial block based on the percentage of the progress bar remaining
		idx_t index = idx_t((blocks_to_draw - static_cast<double>(idx_t(blocks_to_draw))) * PARTIAL_BLOCK_COUNT);
		if (index >= PARTIAL_BLOCK_COUNT) {
			index = PARTIAL_BLOCK_COUNT - 1;
		}
		result += PROGRESS_PARTIAL[index];
		i++;
	}
	for (; i < PROGRESS_BAR_WIDTH; i++) {
		result += PROGRESS_EMPTY;
	}
	result += PROGRESS_END;
	result += " ";

	Printer::RawPrint(OutputStream::STREAM_STDOUT, result);
}